

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

int decode_block(jpeg *j,short *data,huffman *hdc,huffman *hac,int b)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  char cVar4;
  long lVar5;
  
  iVar1 = decode(j,hdc);
  if (iVar1 < 0) {
    failure_reason = "Corrupt JPEG";
LAB_0014f11f:
    iVar3 = 0;
  }
  else {
    data[0x38] = 0;
    data[0x39] = 0;
    data[0x3a] = 0;
    data[0x3b] = 0;
    data[0x3c] = 0;
    data[0x3d] = 0;
    data[0x3e] = 0;
    data[0x3f] = 0;
    data[0x30] = 0;
    data[0x31] = 0;
    data[0x32] = 0;
    data[0x33] = 0;
    data[0x34] = 0;
    data[0x35] = 0;
    data[0x36] = 0;
    data[0x37] = 0;
    data[0x28] = 0;
    data[0x29] = 0;
    data[0x2a] = 0;
    data[0x2b] = 0;
    data[0x2c] = 0;
    data[0x2d] = 0;
    data[0x2e] = 0;
    data[0x2f] = 0;
    data[0x20] = 0;
    data[0x21] = 0;
    data[0x22] = 0;
    data[0x23] = 0;
    data[0x24] = 0;
    data[0x25] = 0;
    data[0x26] = 0;
    data[0x27] = 0;
    data[0x18] = 0;
    data[0x19] = 0;
    data[0x1a] = 0;
    data[0x1b] = 0;
    data[0x1c] = 0;
    data[0x1d] = 0;
    data[0x1e] = 0;
    data[0x1f] = 0;
    data[0x10] = 0;
    data[0x11] = 0;
    data[0x12] = 0;
    data[0x13] = 0;
    data[0x14] = 0;
    data[0x15] = 0;
    data[0x16] = 0;
    data[0x17] = 0;
    data[8] = 0;
    data[9] = 0;
    data[10] = 0;
    data[0xb] = 0;
    data[0xc] = 0;
    data[0xd] = 0;
    data[0xe] = 0;
    data[0xf] = 0;
    data[0] = 0;
    data[1] = 0;
    data[2] = 0;
    data[3] = 0;
    data[4] = 0;
    data[5] = 0;
    data[6] = 0;
    data[7] = 0;
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = extend_receive(j,iVar1);
    }
    iVar1 = iVar1 + j->img_comp[b].dc_pred;
    j->img_comp[b].dc_pred = iVar1;
    *data = (short)iVar1;
    iVar1 = 1;
    do {
      uVar2 = decode(j,hac);
      if ((int)uVar2 < 0) {
        failure_reason = "Corrupt JPEG";
        cVar4 = '\x01';
      }
      else if ((uVar2 & 0xf) == 0) {
        iVar3 = iVar1 + 0x10;
        if (uVar2 != 0xf0) {
          iVar3 = iVar1;
        }
        iVar1 = iVar3;
        cVar4 = (uVar2 != 0xf0) * '\x02';
      }
      else {
        lVar5 = (long)iVar1 + (ulong)(uVar2 >> 4);
        iVar3 = extend_receive(j,uVar2 & 0xf);
        iVar1 = (int)lVar5 + 1;
        data[""[lVar5]] = (short)iVar3;
        cVar4 = '\0';
      }
      iVar3 = 1;
      if (cVar4 != '\0') {
        if (cVar4 == '\x02') {
          return 1;
        }
        goto LAB_0014f11f;
      }
    } while (iVar1 < 0x40);
  }
  return iVar3;
}

Assistant:

static int decode_block(jpeg *j, short data[64], huffman *hdc, huffman *hac, int b)
{
   int diff,dc,k;
   int t = decode(j, hdc);
   if (t < 0) return e("bad huffman code","Corrupt JPEG");

   // 0 all the ac values now so we can do it 32-bits at a time
   memset(data,0,64*sizeof(data[0]));

   diff = t ? extend_receive(j, t) : 0;
   dc = j->img_comp[b].dc_pred + diff;
   j->img_comp[b].dc_pred = dc;
   data[0] = (short) dc;

   // decode AC components, see JPEG spec
   k = 1;
   do {
      int r,s;
      int rs = decode(j, hac);
      if (rs < 0) return e("bad huffman code","Corrupt JPEG");
      s = rs & 15;
      r = rs >> 4;
      if (s == 0) {
         if (rs != 0xf0) break; // end block
         k += 16;
      } else {
         k += r;
         // decode into unzigzag'd location
         data[dezigzag[k++]] = (short) extend_receive(j,s);
      }
   } while (k < 64);
   return 1;
}